

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

void SUNSparseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  FILE *in_RSI;
  long *in_RDI;
  char *indexname;
  char *matrixtype;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  char *local_38;
  char *local_30;
  long local_28;
  long local_20;
  
  if (*(int *)(*in_RDI + 0x28) == 0) {
    local_38 = "col";
    local_30 = "CSC";
  }
  else {
    local_38 = "row";
    local_30 = "CSR";
  }
  fprintf(in_RSI,"\n");
  fprintf(in_RSI,"%ld by %ld %s matrix, NNZ: %ld \n",*(undefined8 *)*in_RDI,
          *(undefined8 *)(*in_RDI + 8),local_30,*(undefined8 *)(*in_RDI + 0x10));
  for (local_28 = 0; local_28 < *(long *)(*in_RDI + 0x18); local_28 = local_28 + 1) {
    fprintf(in_RSI,"%s %ld : locations %ld to %ld\n",local_38,local_28,
            *(undefined8 *)(*(long *)(*in_RDI + 0x38) + local_28 * 8),
            *(long *)(*(long *)(*in_RDI + 0x38) + 8 + local_28 * 8) + -1);
    fprintf(in_RSI,"  ");
    local_20 = *(long *)(*(long *)(*in_RDI + 0x38) + local_28 * 8);
    while( true ) {
      if (*(long *)(*(long *)(*in_RDI + 0x38) + 8 + local_28 * 8) <= local_20) break;
      fprintf(in_RSI,"%ld: % .15e  ",*(undefined8 *)(*(long *)(*in_RDI + 0x20) + local_20 * 8),
              *(undefined8 *)(*(long *)(*in_RDI + 0x30) + local_20 * 8));
      local_20 = local_20 + 1;
    }
    fprintf(in_RSI,"\n");
  }
  return;
}

Assistant:

void SUNSparseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  const char* matrixtype;
  const char* indexname;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    indexname  = "col";
    matrixtype = "CSC";
  }
  else
  {
    indexname  = "row";
    matrixtype = "CSR";
  }
  fprintf(outfile, "\n");
  fprintf(outfile, "%ld by %ld %s matrix, NNZ: %ld \n", (long int)SM_ROWS_S(A),
          (long int)SM_COLUMNS_S(A), matrixtype, (long int)SM_NNZ_S(A));
  for (j = 0; j < SM_NP_S(A); j++)
  {
    fprintf(outfile, "%s %ld : locations %ld to %ld\n", indexname, (long int)j,
            (long int)(SM_INDEXPTRS_S(A))[j],
            (long int)(SM_INDEXPTRS_S(A))[j + 1] - 1);
    fprintf(outfile, "  ");
    for (i = (SM_INDEXPTRS_S(A))[j]; i < (SM_INDEXPTRS_S(A))[j + 1]; i++)
    {
      fprintf(outfile, "%ld: " SUN_FORMAT_E "  ",
              (long int)(SM_INDEXVALS_S(A))[i], (SM_DATA_S(A))[i]);
    }
    fprintf(outfile, "\n");
  }
  return;
}